

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_PointerTuple.cpp
# Opt level: O0

string * __thiscall Type_PointerTuple::SoftPrint_abi_cxx11_(Type_PointerTuple *this)

{
  ostream *poVar1;
  long in_RSI;
  TypeCluster *in_RDI;
  stringstream ss;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [384];
  TypeCluster *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"(");
  if (*(long *)(in_RSI + 0x10) != 0) {
    TypeCluster::SoftPrint_abi_cxx11_(this_00);
    std::operator<<(local_188,local_1c8);
    std::__cxx11::string::~string(local_1c8);
  }
  poVar1 = std::operator<<(local_188,"aI=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0x18));
  poVar1 = std::operator<<(poVar1,",oI=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0x1c));
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return (string *)in_RDI;
}

Assistant:

string Type_PointerTuple::SoftPrint() const
{
    stringstream ss;
    ss <<"(";
    if(_m_pred != 0)
    {
        ss << _m_pred->SoftPrint();
    }
    ss << "aI=" << _m_aI << ",oI="<< _m_oI << ")";
    return(ss.str());
}